

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_dimensional_inverse_fast_fourier_transform.cc
# Opt level: O3

bool __thiscall
sptk::TwoDimensionalInverseFastFourierTransform::Run
          (TwoDimensionalInverseFastFourierTransform *this,Matrix *real_part_input,
          Matrix *imag_part_input,Matrix *real_part_output,Matrix *imag_part_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_02;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_03;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_04;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_05;
  int num_row;
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer ppdVar4;
  pointer ppdVar5;
  void *pvVar6;
  bool bVar7;
  bool bVar8;
  pointer pvVar9;
  int iVar10;
  pointer pvVar11;
  size_t sVar12;
  long lVar13;
  pointer pdVar14;
  size_type __new_size;
  long lVar15;
  
  if ((this->is_valid_ == true) && (real_part_input->num_row_ == this->num_row_)) {
    bVar7 = false;
    if ((real_part_input->num_column_ == this->num_column_) &&
       ((((bVar7 = false, imag_part_input->num_row_ == real_part_input->num_row_ &&
          (bVar7 = false, buffer != (Buffer *)0x0)) && (imag_part_output != (Matrix *)0x0)) &&
        ((real_part_output != (Matrix *)0x0 &&
         (imag_part_input->num_column_ == real_part_input->num_column_)))))) {
      __new_size = (size_type)this->fft_length_;
      this_00 = &buffer->real_part_input_;
      if ((long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
      }
      this_01 = &buffer->imag_part_input_;
      if ((long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
      }
      this_02 = &buffer->first_real_part_outputs_;
      if (((long)(buffer->first_real_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(buffer->first_real_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size
          != 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(this_02,__new_size);
      }
      this_03 = &buffer->first_imag_part_outputs_;
      if (((long)(buffer->first_imag_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(buffer->first_imag_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size
          != 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(this_03,__new_size);
      }
      this_04 = &buffer->second_real_part_outputs_;
      if (((long)(buffer->second_real_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(buffer->second_real_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size
          != 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(this_04,__new_size);
      }
      this_05 = &buffer->second_imag_part_outputs_;
      if (((long)(buffer->second_imag_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(buffer->second_imag_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size
          != 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(this_05,__new_size);
      }
      iVar10 = real_part_output->num_row_;
      num_row = this->fft_length_;
      if ((iVar10 != num_row) || (real_part_output->num_column_ != iVar10)) {
        Matrix::Resize(real_part_output,num_row,num_row);
        iVar10 = this->fft_length_;
      }
      if ((imag_part_output->num_row_ != iVar10) || (imag_part_output->num_column_ != iVar10)) {
        Matrix::Resize(imag_part_output,iVar10,iVar10);
      }
      pdVar1 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar2 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pdVar3 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar10 = this->num_row_;
      pdVar14 = pdVar1 + iVar10;
      if (pdVar14 != pdVar2) {
        memset(pdVar14,0,((long)pdVar2 + (-8 - (long)pdVar14) & 0xfffffffffffffff8U) + 8);
      }
      pdVar2 = pdVar3 + iVar10;
      pdVar14 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pdVar2 != pdVar14) {
        memset(pdVar2,0,((long)pdVar14 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
      }
      lVar13 = (long)this->num_column_;
      if (0 < lVar13) {
        lVar15 = 0;
        do {
          iVar10 = this->num_row_;
          if (0 < (long)iVar10) {
            ppdVar4 = (real_part_input->index_).
                      super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            ppdVar5 = (imag_part_input->index_).
                      super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar13 = 0;
            do {
              pdVar1[lVar13] = ppdVar4[lVar13][lVar15];
              pdVar3[lVar13] = ppdVar5[lVar13][lVar15];
              lVar13 = lVar13 + 1;
            } while (iVar10 != lVar13);
          }
          bVar7 = InverseFastFourierTransform::Run
                            (&this->inverse_fast_fourier_transform_,this_00,this_01,
                             (this_02->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar15,
                             (this_03->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar15);
          if (!bVar7) goto LAB_00106fc7;
          lVar15 = lVar15 + 1;
          lVar13 = (long)this->num_column_;
        } while (lVar15 < lVar13);
      }
      pdVar14 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pdVar2 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar13;
      if (pdVar2 != pdVar14) {
        memset(pdVar2,0,((long)pdVar14 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
      }
      pdVar14 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pdVar2 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar13;
      if (pdVar2 != pdVar14) {
        memset(pdVar2,0,((long)pdVar14 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
      }
      bVar7 = true;
      if (0 < this->fft_length_) {
        lVar13 = 0;
        do {
          iVar10 = this->num_column_;
          if (0 < (long)iVar10) {
            pvVar9 = (this_02->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pvVar11 = (this_03->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar15 = 0;
            do {
              pdVar1[lVar15] =
                   *(double *)
                    (*(long *)&(pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data + lVar13 * 8);
              pdVar3[lVar15] =
                   *(double *)
                    (*(long *)&(pvVar11->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data + lVar13 * 8);
              lVar15 = lVar15 + 1;
              pvVar9 = pvVar9 + 1;
              pvVar11 = pvVar11 + 1;
            } while (iVar10 != lVar15);
          }
          bVar8 = InverseFastFourierTransform::Run
                            (&this->inverse_fast_fourier_transform_,this_00,this_01,
                             (this_04->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar13,
                             (this_05->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar13);
          if (!bVar8) goto LAB_00106fc7;
          lVar13 = lVar13 + 1;
        } while (lVar13 < this->fft_length_);
        if (0 < this->fft_length_) {
          lVar13 = 1;
          lVar15 = 0;
          do {
            pvVar9 = (this_04->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pvVar6 = *(void **)((long)pvVar9 + lVar13 * 8 + -8);
            sVar12 = *(long *)((long)&(pvVar9->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data + lVar13 * 8) - (long)pvVar6;
            if (sVar12 != 0) {
              memmove((real_part_output->index_).
                      super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar15],pvVar6,sVar12);
            }
            pvVar9 = (this_05->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pvVar6 = *(void **)((long)pvVar9 + lVar13 * 8 + -8);
            sVar12 = *(long *)((long)&(pvVar9->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data + lVar13 * 8) - (long)pvVar6;
            if (sVar12 != 0) {
              memmove((imag_part_output->index_).
                      super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar15],pvVar6,sVar12);
            }
            lVar15 = lVar15 + 1;
            lVar13 = lVar13 + 3;
          } while (lVar15 < this->fft_length_);
        }
      }
    }
  }
  else {
LAB_00106fc7:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool TwoDimensionalInverseFastFourierTransform::Run(
    const Matrix& real_part_input, const Matrix& imag_part_input,
    Matrix* real_part_output, Matrix* imag_part_output,
    TwoDimensionalInverseFastFourierTransform::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || real_part_input.GetNumRow() != num_row_ ||
      real_part_input.GetNumColumn() != num_column_ ||
      imag_part_input.GetNumRow() != num_row_ ||
      imag_part_input.GetNumColumn() != num_column_ ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  {
    const std::size_t size(static_cast<std::size_t>(fft_length_));
    if (buffer->real_part_input_.size() != size) {
      buffer->real_part_input_.resize(size);
    }
    if (buffer->imag_part_input_.size() != size) {
      buffer->imag_part_input_.resize(size);
    }
    if (buffer->first_real_part_outputs_.size() != size) {
      buffer->first_real_part_outputs_.resize(size);
    }
    if (buffer->first_imag_part_outputs_.size() != size) {
      buffer->first_imag_part_outputs_.resize(size);
    }
    if (buffer->second_real_part_outputs_.size() != size) {
      buffer->second_real_part_outputs_.resize(size);
    }
    if (buffer->second_imag_part_outputs_.size() != size) {
      buffer->second_imag_part_outputs_.resize(size);
    }
    if (real_part_output->GetNumRow() != fft_length_ ||
        real_part_output->GetNumColumn() != fft_length_) {
      real_part_output->Resize(fft_length_, fft_length_);
    }
    if (imag_part_output->GetNumRow() != fft_length_ ||
        imag_part_output->GetNumColumn() != fft_length_) {
      imag_part_output->Resize(fft_length_, fft_length_);
    }
  }

  double* x(&buffer->real_part_input_[0]);
  double* y(&buffer->imag_part_input_[0]);

  // First stage.
  std::fill(buffer->real_part_input_.begin() + num_row_,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + num_row_,
            buffer->imag_part_input_.end(), 0.0);
  for (int i(0); i < num_column_; ++i) {
    for (int j(0); j < num_row_; ++j) {
      x[j] = real_part_input[j][i];
      y[j] = imag_part_input[j][i];
    }
    if (!inverse_fast_fourier_transform_.Run(
            buffer->real_part_input_, buffer->imag_part_input_,
            &buffer->first_real_part_outputs_[i],
            &buffer->first_imag_part_outputs_[i])) {
      return false;
    }
  }

  // Second stage.
  std::fill(buffer->real_part_input_.begin() + num_column_,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + num_column_,
            buffer->imag_part_input_.end(), 0.0);
  for (int i(0); i < fft_length_; ++i) {
    for (int j(0); j < num_column_; ++j) {
      x[j] = buffer->first_real_part_outputs_[j][i];
      y[j] = buffer->first_imag_part_outputs_[j][i];
    }
    if (!inverse_fast_fourier_transform_.Run(
            buffer->real_part_input_, buffer->imag_part_input_,
            &buffer->second_real_part_outputs_[i],
            &buffer->second_imag_part_outputs_[i])) {
      return false;
    }
  }

  // Save results.
  for (int i(0); i < fft_length_; ++i) {
    std::copy(buffer->second_real_part_outputs_[i].begin(),
              buffer->second_real_part_outputs_[i].end(),
              (*real_part_output)[i]);
    std::copy(buffer->second_imag_part_outputs_[i].begin(),
              buffer->second_imag_part_outputs_[i].end(),
              (*imag_part_output)[i]);
  }

  return true;
}